

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colmatrix.cc
# Opt level: O2

ColMatrix * __thiscall fizplex::ColMatrix::operator=(ColMatrix *this,ColMatrix *rhs)

{
  size_t sVar1;
  SVector *__x;
  size_t i;
  ulong i_00;
  
  sVar1 = rhs->n;
  this->m = rhs->m;
  this->n = sVar1;
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::clear(&this->cols);
  for (i_00 = 0; i_00 < this->n; i_00 = i_00 + 1) {
    __x = column(rhs,i_00);
    std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::push_back(&this->cols,__x);
  }
  return this;
}

Assistant:

ColMatrix &ColMatrix::operator=(const ColMatrix &rhs) {
  m = rhs.m;
  n = rhs.n;
  cols.clear();
  for (size_t i = 0; i < n; i++)
    cols.push_back(rhs.column(i));
  return *this;
}